

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void window_refresh_callback(GLFWwindow *window)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Slot *slot;
  GLFWwindow *window_local;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  glfwGetTime();
  printf("%08x to %i at %0.3f: Window refresh\n",(ulong)uVar2,(ulong)uVar1);
  glfwMakeContextCurrent(window);
  (*glad_glClear)(0x4000);
  glfwSwapBuffers(window);
  return;
}

Assistant:

static void window_refresh_callback(GLFWwindow* window)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Window refresh\n",
           counter++, slot->number, glfwGetTime());

    glfwMakeContextCurrent(window);
    glClear(GL_COLOR_BUFFER_BIT);
    glfwSwapBuffers(window);
}